

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.h
# Opt level: O1

int hydro_sign_final_verify(hydro_sign_state *state,uint8_t *csig,uint8_t *pk)

{
  uint uVar1;
  uint uVar2;
  hydro_x25519_limb_t sixteen;
  uint8_t challenge [32];
  hydro_x25519_fe xo2;
  uint8_t prehash [64];
  hydro_x25519_limb_t local_1a0;
  uint8_t local_198 [32];
  hydro_x25519_limb_t local_178;
  hydro_x25519_limb_t hStack_170;
  hydro_x25519_limb_t hStack_168;
  hydro_x25519_limb_t hStack_160;
  hydro_x25519_limb_t hStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  hydro_x25519_limb_t local_138 [4];
  hydro_x25519_limb_t local_118 [4];
  hydro_x25519_limb_t local_f8;
  hydro_x25519_limb_t hStack_f0;
  hydro_x25519_limb_t hStack_e8;
  hydro_x25519_limb_t hStack_e0;
  hydro_x25519_limb_t hStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  hydro_x25519_limb_t local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  uint8_t local_78 [72];
  
  hydro_hash_final(&state->hash_st,local_78,0x40);
  hydro_sign_challenge(local_198,csig,pk,local_78);
  hydro_x25519_core((hydro_x25519_fe *)&local_178,local_198,pk,false);
  hydro_x25519_core(&local_138,csig + 0x20,"\t",false);
  local_1a0 = 0x10;
  local_98 = *(hydro_x25519_limb_t *)csig;
  uStack_90 = *(undefined8 *)(csig + 8);
  uStack_88 = *(undefined8 *)(csig + 0x10);
  uStack_80 = *(undefined8 *)(csig + 0x18);
  local_f8 = local_178;
  hStack_f0 = hStack_170;
  hStack_e8 = hStack_168;
  hStack_e0 = hStack_160;
  hStack_d8 = hStack_158;
  uStack_d0 = uStack_150;
  uStack_c8 = uStack_148;
  uStack_c0 = uStack_140;
  hydro_x25519_ladder_part1(&local_138);
  hydro_x25519_mul(local_118,&local_178,local_118,4);
  hydro_x25519_mul(local_118,&hStack_158,local_118,4);
  hydro_x25519_mul(local_118,&local_98,local_118,4);
  hydro_x25519_mul(local_118,local_118,&local_1a0,1);
  hydro_x25519_mul(&hStack_d8,&local_98,&hStack_d8,4);
  hydro_x25519_sub(&hStack_d8,&hStack_d8,&local_f8);
  hydro_x25519_mul(&hStack_d8,&hStack_d8,&hStack_d8,4);
  hydro_x25519_sub(&hStack_d8,&hStack_d8,local_118);
  uVar1 = hydro_x25519_canon(local_118);
  uVar2 = hydro_x25519_canon(&hStack_d8);
  return ~uVar2 | uVar1;
}

Assistant:

int
hydro_sign_final_verify(hydro_sign_state *state, const uint8_t csig[hydro_sign_BYTES],
                        const uint8_t pk[hydro_sign_PUBLICKEYBYTES])
{
    uint8_t        challenge[hydro_sign_CHALLENGEBYTES];
    uint8_t        prehash[hydro_sign_PREHASHBYTES];
    const uint8_t *nonce = &csig[0];

    hydro_hash_final(&state->hash_st, prehash, sizeof prehash);
    hydro_sign_challenge(challenge, nonce, pk, prehash);

    return hydro_sign_verify_challenge(csig, challenge, pk);
}